

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall
helics::CommonCore::setGlobal(CommonCore *this,string_view valueName,string_view value)

{
  size_t size;
  ActionMessage querycmd;
  ActionMessage AStack_e8;
  
  size = valueName._M_len;
  ActionMessage::ActionMessage(&AStack_e8,cmd_set_global);
  AStack_e8.dest_id.gid = 1;
  AStack_e8.source_id.gid = -0x396fe;
  AStack_e8.payload.bufferSize = size;
  if ((AStack_e8.payload.heap != (byte *)valueName._M_str) &&
     (SmallBuffer::reserve(&AStack_e8.payload,size), size != 0)) {
    memcpy(AStack_e8.payload.heap,valueName._M_str,size);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&AStack_e8.stringData,1);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (AStack_e8.stringData.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0,
             (AStack_e8.stringData.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_string_length,value._M_str,value._M_len
            );
  BrokerBase::addActionMessage(&this->super_BrokerBase,&AStack_e8);
  ActionMessage::~ActionMessage(&AStack_e8);
  return;
}

Assistant:

void CommonCore::setGlobal(std::string_view valueName, std::string_view value)
{
    ActionMessage querycmd(CMD_SET_GLOBAL);
    querycmd.dest_id = gRootBrokerID;
    querycmd.source_id = gDirectCoreId;
    querycmd.payload = valueName;
    querycmd.setStringData(value);
    addActionMessage(std::move(querycmd));
}